

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

bool __thiscall
Lodtalk::MethodSemanticAnalysis::optimizeMessage
          (MethodSemanticAnalysis *this,MessageSendNode *node,CompilerOptimizedSelector selectorId)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *node_00;
  char cVar3;
  int iVar4;
  Node *node_01;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *__x;
  undefined8 extraout_RAX;
  bool bVar5;
  Node *startValue;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> arguments;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> local_48;
  
  node_01 = AST::MessageSendNode::getReceiver(node);
  __x = AST::MessageSendNode::getArguments(node);
  std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::vector(&local_48,__x);
  switch(selectorId) {
  case IfTrue:
  case IfFalse:
  case IfNil:
  case IfNotNil:
    pNVar1 = *local_48.
              super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    (*node_01->_vptr_Node[2])(node_01,this);
    inlineBlock(this,pNVar1,0);
    break;
  case IfTrueIfFalse:
  case IfFalseIfTrue:
  case IfNilIfNotNil:
  case IfNotNilIfNil:
    pNVar1 = *local_48.
              super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pNVar2 = local_48.
             super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>._M_impl
             .super__Vector_impl_data._M_start[1];
    (*node_01->_vptr_Node[2])(node_01,this);
    inlineBlock(this,pNVar1,0);
    inlineBlock(this,pNVar2,0);
    break;
  case WhileTrue:
  case WhileFalse:
    iVar4 = (*node_01->_vptr_Node[5])(node_01);
    if ((char)iVar4 == '\0') goto LAB_0013771b;
    pNVar1 = *local_48.
              super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    inlineBlock(this,node_01,0);
    inlineBlock(this,pNVar1,0);
    break;
  default:
    optimizeMessage();
    if (local_48.super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    _Unwind_Resume(extraout_RAX);
  case ToByDo:
    pNVar1 = *local_48.
              super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pNVar2 = local_48.
             super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>._M_impl
             .super__Vector_impl_data._M_start[1];
    node_00 = local_48.
              super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start[2];
    iVar4 = (*node_00->_vptr_Node[5])(node_00);
    cVar3 = (char)iVar4;
    if (cVar3 != '\0') {
      (*node_01->_vptr_Node[2])(node_01,this);
      (*pNVar1->_vptr_Node[2])(pNVar1,this);
      (*pNVar2->_vptr_Node[2])(pNVar2,this);
      inlineBlock(this,node_00,1);
LAB_00137712:
      if (cVar3 != '\0') break;
    }
    goto LAB_0013771b;
  case ToDo:
    pNVar1 = *local_48.
              super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pNVar2 = local_48.
             super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>._M_impl
             .super__Vector_impl_data._M_start[1];
    iVar4 = (*pNVar2->_vptr_Node[5])(pNVar2);
    cVar3 = (char)iVar4;
    if (cVar3 != '\0') {
      (*node_01->_vptr_Node[2])(node_01,this);
      (*pNVar1->_vptr_Node[2])(pNVar1,this);
      inlineBlock(this,pNVar2,1);
      goto LAB_00137712;
    }
LAB_0013771b:
    bVar5 = false;
    goto LAB_0013771d;
  }
  bVar5 = true;
LAB_0013771d:
  if (local_48.super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar5;
}

Assistant:

bool MethodSemanticAnalysis::optimizeMessage(MessageSendNode *node, CompilerOptimizedSelector selectorId)
{
    auto receiver = node->getReceiver();
    auto arguments = node->getArguments();

    switch(selectorId)
    {
    case CompilerOptimizedSelector::IfTrue:
    case CompilerOptimizedSelector::IfFalse:
    case CompilerOptimizedSelector::IfNil:
    case CompilerOptimizedSelector::IfNotNil:
        {
            auto thenBlock = arguments[0];
            receiver->acceptVisitor(this);
            inlineBlock(thenBlock, 0);
        }
        break;
    case CompilerOptimizedSelector::IfTrueIfFalse:
    case CompilerOptimizedSelector::IfFalseIfTrue:
    case CompilerOptimizedSelector::IfNotNilIfNil:
    case CompilerOptimizedSelector::IfNilIfNotNil:

        {
            auto thenBlock = arguments[0];
            auto elseBlock = arguments[1];
            receiver->acceptVisitor(this);
            inlineBlock(thenBlock, 0);
            inlineBlock(elseBlock, 0);
        }
        break;
    case CompilerOptimizedSelector::WhileTrue:
    case CompilerOptimizedSelector::WhileFalse:
        {
            if(!receiver->isBlockExpression())
                return false;
            auto conditionBlock = receiver;
            auto bodyBlock = arguments[0];
            inlineBlock(conditionBlock, 0);
            inlineBlock(bodyBlock, 0);
        }
        break;
    case CompilerOptimizedSelector::ToDo:
        {
            auto startValue = receiver;
            auto stopValue = arguments[0];
            auto bodyBlock = arguments[1];
            if(!bodyBlock->isBlockExpression())
                return false;

            startValue->acceptVisitor(this);
            stopValue->acceptVisitor(this);
            inlineBlock(bodyBlock, 1);
        }
        break;
    case CompilerOptimizedSelector::ToByDo:
        {
            auto startValue = receiver;
            auto stopValue = arguments[0];
            auto stepValue = arguments[1];
            auto bodyBlock = arguments[2];
            if(!bodyBlock->isBlockExpression())
                return false;

            startValue->acceptVisitor(this);
            stopValue->acceptVisitor(this);
            stepValue->acceptVisitor(this);
            inlineBlock(bodyBlock, 1);
        }
        break;
    default:
        LODTALK_UNIMPLEMENTED();
    }

    return true;
}